

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary_impl.hpp
# Opt level: O2

int __thiscall
ylt::metric::detail::summary_impl<unsigned_long,_6UL>::stat
          (summary_impl<unsigned_long,_6UL> *this,char *__file,stat *__buf)

{
  data_t *this_00;
  data_t *this_01;
  double *pdVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  long *in_RCX;
  long lVar5;
  EVP_PKEY_CTX *ctx;
  double *pdVar6;
  double dVar7;
  undefined1 auVar8 [16];
  uint uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  vector<float,_std::allocator<float>_> *result;
  float v;
  data_copy_t data_copy;
  undefined8 local_a0;
  int local_94;
  long *local_90;
  undefined1 local_88 [24];
  undefined1 auStack_70 [32];
  __gid_t local_50;
  undefined1 local_48 [16];
  
  refresh((summary_impl<unsigned_long,_6UL> *)__file);
  *in_RCX = 0;
  __buf->st_dev = 0;
  auStack_70._8_8_ = (pointer)0x0;
  auStack_70._16_8_ = (pointer)0x0;
  local_88._16_8_ = (pointer)0x0;
  auStack_70._0_8_ = (pointer)0x0;
  local_88._0_8_ = (pointer)0x0;
  local_88._8_8_ = (pointer)0x0;
  auStack_70._24_4_ = 0;
  auStack_70._28_4_ = 0;
  this_00 = *(data_t **)(__file + 0x18);
  this_01 = *(data_t **)(__file + 0x20);
  if (this_01 == (data_t *)0x0 && this_00 == (data_t *)0x0) {
    local_a0 = local_a0 & 0xffffffff00000000;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)this,
               (*(long **)(__file + 0x10))[1] - **(long **)(__file + 0x10) >> 3,
               (value_type_conflict4 *)&local_a0,(allocator_type *)&local_94);
  }
  else {
    local_90 = in_RCX;
    if (this_00 != (data_t *)0x0) {
      data_t::stat(this_00,(char *)in_RCX,(stat *)local_88);
    }
    if (this_01 != (data_t *)0x0) {
      data_t::stat(this_01,(char *)local_90,(stat *)auStack_70);
    }
    if (*local_90 == 0) {
      local_a0 = (ulong)local_a0._4_4_ << 0x20;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)this,
                 (*(long **)(__file + 0x10))[1] - **(long **)(__file + 0x10) >> 3,
                 (value_type_conflict4 *)&local_a0,(allocator_type *)&local_94);
    }
    else {
      local_a0 = 0x2000;
      local_94 = 0;
      std::vector<std::pair<short,unsigned_long>,std::allocator<std::pair<short,unsigned_long>>>::
      emplace_back<unsigned_long,int>
                ((vector<std::pair<short,unsigned_long>,std::allocator<std::pair<short,unsigned_long>>>
                  *)local_88,&local_a0,&local_94);
      ctx = (EVP_PKEY_CTX *)&local_a0;
      local_a0 = 0x2000;
      local_94 = 0;
      std::vector<std::pair<short,unsigned_long>,std::allocator<std::pair<short,unsigned_long>>>::
      emplace_back<unsigned_long,int>
                ((vector<std::pair<short,unsigned_long>,std::allocator<std::pair<short,unsigned_long>>>
                  *)auStack_70,(unsigned_long *)ctx,&local_94);
      data_copy_t::init((data_copy_t *)local_88,ctx);
      (this->refresh_time_).__r = 0;
      (this->tp_).super___atomic_base<unsigned_long>._M_i = 0;
      this->rate_ = (vector<double,_std::allocator<double>_> *)0x0;
      std::vector<float,_std::allocator<float>_>::reserve
                ((vector<float,_std::allocator<float>_> *)this,
                 (*(long **)(__file + 0x10))[1] - **(long **)(__file + 0x10) >> 3);
      local_a0 = CONCAT44(local_a0._4_4_,0xdf800000);
      pdVar1 = (double *)(*(undefined8 **)(__file + 0x10))[1];
      lVar5 = 0;
      for (pdVar6 = (double *)**(undefined8 **)(__file + 0x10); pdVar6 != pdVar1;
          pdVar6 = pdVar6 + 1) {
        dVar7 = *pdVar6;
        if (0.0 <= dVar7) {
          uVar9 = 0x3ff00000;
          if (1.0 < dVar7) {
            dVar7 = 1.0;
          }
          lVar2 = *local_90;
          auVar10._8_4_ = (int)((ulong)lVar2 >> 0x20);
          auVar10._0_8_ = lVar2;
          auVar10._12_4_ = 0x45300000;
          auVar11._8_8_ = auVar10._8_8_ - 1.9342813113834067e+25;
          if (lVar2 == 0) {
            uVar9 = 0;
          }
          dVar12 = auVar11._8_8_ + ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0);
          if (dVar7 * dVar12 <= dVar12) {
            dVar12 = dVar7 * dVar12;
          }
          auVar11._0_8_ = ~-(ulong)(dVar7 == 0.0) & (ulong)dVar12;
          local_48 = auVar11 | ZEXT416(uVar9 & (uint)(-(ulong)(dVar7 == 0.0) >> 0x20)) << 0x20;
          while (auVar8._8_4_ = (int)((ulong)lVar5 >> 0x20), auVar8._0_8_ = lVar5,
                auVar8._12_4_ = 0x45300000,
                (auVar8._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0) <
                (double)local_48._0_8_) {
            uVar4 = *(ulong *)(*(long *)(local_88 + (long)(int)local_50 * 0x18) + 8 +
                              (long)*(int *)(auStack_70 + (long)(int)local_50 * 4 + 0x18) * 0x10);
            uVar9 = *(uint *)(*(long *)(local_88 + (long)(int)local_50 * 0x18) +
                             (long)*(int *)(auStack_70 + (long)(int)local_50 * 4 + 0x18) * 0x10);
            uVar3 = 0x1fff - uVar9;
            if (-1 < (short)uVar9) {
              uVar3 = uVar9;
            }
            local_a0 = CONCAT44(local_a0._4_4_,
                                *(float *)(summary_impl<unsigned_long,6ul>::get_decode_table()::
                                           table + ((ulong)uVar3 & 0xffff) * 4));
            lVar5 = lVar5 + uVar4;
            __buf->st_dev =
                 (__dev_t)((double)(*(float *)(summary_impl<unsigned_long,6ul>::get_decode_table()::
                                               table + ((ulong)uVar3 & 0xffff) * 4) * (float)uVar4)
                          + (double)__buf->st_dev);
            data_copy_t::inc((data_copy_t *)local_88);
          }
          std::vector<float,_std::allocator<float>_>::push_back
                    ((vector<float,_std::allocator<float>_> *)this,(value_type_conflict4 *)&local_a0
                    );
        }
        else {
          std::vector<float,_std::allocator<float>_>::push_back
                    ((vector<float,_std::allocator<float>_> *)this,(value_type_conflict4 *)&local_a0
                    );
        }
      }
      while( true ) {
        uVar4 = (ulong)*(ushort *)
                        (*(long *)(local_88 + (long)(int)local_50 * 0x18) +
                        (long)*(int *)(auStack_70 + (long)(int)local_50 * 4 + 0x18) * 0x10);
        if (0x1fff < uVar4) break;
        __buf->st_dev =
             (__dev_t)((double)((float)*(ulong *)(*(long *)(local_88 + (long)(int)local_50 * 0x18) +
                                                  8 + (long)*(int *)(auStack_70 +
                                                                    (long)(int)local_50 * 4 + 0x18)
                                                      * 0x10) *
                               *(float *)(summary_impl<unsigned_long,6ul>::get_decode_table()::table
                                         + uVar4 * 4)) + (double)__buf->st_dev);
        data_copy_t::inc((data_copy_t *)local_88);
      }
    }
  }
  data_copy_t::~data_copy_t((data_copy_t *)local_88);
  return (int)this;
}

Assistant:

std::vector<float> stat(double& sum, uint64_t& count) {
    refresh();
    count = 0;
    sum = 0;
    data_copy_t data_copy;
    {
      data_t* ar[2] = {data_[0], data_[1]};
      if (ar[0] == nullptr && ar[1] == nullptr) [[unlikely]] {
        return std::vector<float>(rate_.size(), 0.0f);
      }
      if (ar[0]) {
        ar[0]->stat(count, data_copy.arr[0]);
      }
      if (ar[1]) {
        ar[1]->stat(count, data_copy.arr[1]);
      }
    }
    if (count == 0) {
      return std::vector<float>(rate_.size(), 0);
    }
    uint64_t count_now = 0;
    data_copy.arr[0].emplace_back(bucket_size / 2, 0);
    data_copy.arr[1].emplace_back(bucket_size / 2, 0);
    data_copy.init();
    std::vector<float> result;
    result.reserve(rate_.size());
    float v = -float16_max;
    for (double e : rate_) {
      if (std::isnan(e) || e < 0) {
        result.push_back(v);
        continue;
      }
      else if (e > 1) [[unlikely]] {
        e = 1;
      }
      auto target_count = std::min<double>(e * count, count);
      if (e == 0) {
        target_count = std::min(uint64_t{1}, count);
      }
      while (true) {
        if (target_count <= count_now) [[unlikely]] {
          result.push_back(v);
          break;
        }
        auto tmp = data_copy.count();
        count_now += tmp;
        v = decode(data_t::get_raw_index(data_copy.value()));
        sum += v * tmp;
        data_copy.inc();
      }
    }
    while (data_copy.value() < bucket_size / 2) {
      sum +=
          decode(data_t::get_raw_index(data_copy.value())) * data_copy.count();
      data_copy.inc();
    }
    return result;
  }